

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

Abc_Obj_t * Abc_NtkTopmost_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int LevelCut)

{
  Abc_Aig_t *pMan;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *p1;
  
  if (((ulong)pNode & 1) == 0) {
    pAVar1 = (Abc_Obj_t *)(pNode->field_6).pTemp;
    if (pAVar1 == (Abc_Obj_t *)0x0) {
      if ((uint)LevelCut < *(uint *)&pNode->field_0x14 >> 0xc) {
        Abc_NtkTopmost_rec(pNtkNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray]
                           ,LevelCut);
        Abc_NtkTopmost_rec(pNtkNew,(Abc_Obj_t *)
                                   pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]],LevelCut);
        pMan = (Abc_Aig_t *)pNtkNew->pManFunc;
        pAVar1 = Abc_ObjChild0Copy(pNode);
        p1 = Abc_ObjChild1Copy(pNode);
        pAVar1 = Abc_AigAnd(pMan,pAVar1,p1);
      }
      else {
        pAVar1 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PI);
      }
      (pNode->field_6).pCopy = pAVar1;
    }
    return pAVar1;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcStrash.c"
                ,0x20f,"Abc_Obj_t *Abc_NtkTopmost_rec(Abc_Ntk_t *, Abc_Obj_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NtkTopmost_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int LevelCut )
{
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->pCopy )
        return pNode->pCopy;
    if ( pNode->Level <= (unsigned)LevelCut )
        return pNode->pCopy = Abc_NtkCreatePi( pNtkNew );
    Abc_NtkTopmost_rec( pNtkNew, Abc_ObjFanin0(pNode), LevelCut );
    Abc_NtkTopmost_rec( pNtkNew, Abc_ObjFanin1(pNode), LevelCut );
    return pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}